

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

string * __thiscall
leveldb::DBTest::Get(string *__return_storage_ptr__,DBTest *this,string *k,Snapshot *snapshot)

{
  Status s;
  Status local_48;
  string local_40;
  undefined2 local_20 [4];
  Snapshot *local_18;
  
  local_20[0] = 0x100;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (k->_M_dataplus)._M_p;
  local_40._M_string_length = k->_M_string_length;
  local_18 = snapshot;
  (*this->db_->_vptr_DB[5])(&local_48,this->db_,local_20,&local_40,__return_storage_ptr__);
  if (local_48.state_ != (char *)0x0) {
    if (local_48.state_[4] == '\x01') {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      Status::ToString_abi_cxx11_(&local_40,&local_48);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  Status::~Status(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Get(const std::string& k, const Snapshot* snapshot = nullptr) {
    ReadOptions options;
    options.snapshot = snapshot;
    std::string result;
    Status s = db_->Get(options, k, &result);
    if (s.IsNotFound()) {
      result = "NOT_FOUND";
    } else if (!s.ok()) {
      result = s.ToString();
    }
    return result;
  }